

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

string * toml::format_error<>(string *title,source_location *loc,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  source_location *in_stack_00000010;
  string *in_stack_00000018;
  error_info *in_stack_00000130;
  string *in_stack_00000138;
  source_location *in_stack_fffffffffffffe48;
  source_location *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  source_location local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41 [2];
  
  this_00 = local_41;
  __str = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__str,(allocator<char> *)in_RDI);
  this = &local_d0;
  std::__cxx11::string::string(this_00,__str);
  source_location::source_location(this,in_stack_fffffffffffffe48);
  std::__cxx11::string::string(this_00,__str);
  make_error_info<>(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  format_error(in_stack_00000138,in_stack_00000130);
  error_info::~error_info((error_info *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return (string *)__str;
}

Assistant:

std::string format_error(std::string title,
        source_location loc, std::string msg, Ts&& ... tail)
{
    return format_error("", make_error_info(std::move(title),
                std::move(loc), std::move(msg), std::forward<Ts>(tail)...));
}